

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_reader.cpp
# Opt level: O2

void __thiscall duckdb::TableDataReader::ReadTableData(TableDataReader *this)

{
  pointer pCVar1;
  pointer pPVar2;
  unsigned_long uVar3;
  MetaBlockPointer MVar4;
  BinaryDeserializer stats_deserializer;
  BinaryDeserializer BStack_2a8;
  
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&this->info->base);
  BinaryDeserializer::BinaryDeserializer(&BStack_2a8,&this->reader->super_ReadStream);
  BinaryDeserializer::OnObjectBegin(&BStack_2a8);
  pPVar2 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  TableStatistics::Deserialize
            (&pPVar2->table_stats,&BStack_2a8.super_Deserializer,
             (ColumnList *)&pCVar1[1].catalog.field_2);
  BinaryDeserializer::OnObjectEnd(&BStack_2a8);
  uVar3 = ReadStream::Read<unsigned_long>(&this->reader->super_ReadStream);
  pPVar2 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  pPVar2->row_group_count = uVar3;
  MVar4 = MetadataReader::GetMetaBlockPointer(this->reader);
  pPVar2 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
           ::operator->(&this->info->data);
  pPVar2->block_pointer = MVar4;
  Deserializer::~Deserializer(&BStack_2a8.super_Deserializer);
  return;
}

Assistant:

void TableDataReader::ReadTableData() {
	auto &columns = info.Base().columns;
	D_ASSERT(!columns.empty());

	// We stored the table statistics as a unit in FinalizeTable.
	BinaryDeserializer stats_deserializer(reader);
	stats_deserializer.Begin();
	info.data->table_stats.Deserialize(stats_deserializer, columns);
	stats_deserializer.End();

	// Deserialize the row group pointers (lazily, just set the count and the pointer to them for now)
	info.data->row_group_count = reader.Read<uint64_t>();
	info.data->block_pointer = reader.GetMetaBlockPointer();
}